

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O1

void __thiscall
gss::LubyRestartsSchedule::LubyRestartsSchedule(LubyRestartsSchedule *this,longlong m)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  (this->super_RestartsSchedule)._vptr_RestartsSchedule =
       (_func_int **)&PTR__LubyRestartsSchedule_001587e0;
  this->_backtracks_remaining = m;
  (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_sequence;
  (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_sequence;
  (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size
       = 0;
  (this->_current_sequence)._M_node = (_List_node_base *)0x0;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)m;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  (this->_current_sequence)._M_node = p_Var2;
  return;
}

Assistant:

LubyRestartsSchedule::LubyRestartsSchedule(long long m) :
    _backtracks_remaining(m)
{
    _current_sequence = _sequence.insert(_sequence.end(), m);
}